

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list_functions.h
# Opt level: O2

void LinkedList::delete_all<std::__cxx11::string>
               (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                **head)

{
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  
  this = *head;
  if (this == (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) {
    return;
  }
  if (this->_next !=
      (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0)
  {
    delete_all<std::__cxx11::string>(&this->_next);
    this = *head;
    if (this == (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
      this = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
      goto LAB_0010be57;
    }
  }
  std::__cxx11::string::~string((string *)this);
LAB_0010be57:
  operator_delete(this);
  *head = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          0x0;
  return;
}

Assistant:

void delete_all(Node<T>*& head) {
        if (head == NULL)
            return;
        if (head->_next != NULL)
            delete_all(head->_next);
        delete head;
        head = NULL;
    }